

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall
QTreeWidgetItem::QTreeWidgetItem
          (QTreeWidgetItem *this,QTreeWidget *treeview,QTreeWidgetItem *after,int type)

{
  long lVar1;
  QFlagsStorage<Qt::ItemFlag> index;
  QFlags<Qt::ItemFlag> QVar2;
  QTreeWidgetItemPrivate *v;
  QTreeModel *pQVar3;
  int in_ECX;
  QTreeWidgetItem *in_RDX;
  QTreeWidgetItem *in_RDI;
  long in_FS_OFFSET;
  qsizetype in_stack_00000008;
  int i;
  QTreeModel *model;
  undefined4 in_stack_ffffffffffffff98;
  ItemFlag in_stack_ffffffffffffff9c;
  QTreeWidgetItemPrivate *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_QTreeWidgetItem = (_func_int **)&PTR__QTreeWidgetItem_00d31678;
  in_RDI->rtti = in_ECX;
  QList<QList<QWidgetItemData>_>::QList((QList<QList<QWidgetItemData>_> *)0x9131c1);
  in_RDI->view = (QTreeWidget *)0x0;
  v = (QTreeWidgetItemPrivate *)operator_new(0x30);
  QTreeWidgetItemPrivate::QTreeWidgetItemPrivate
            (in_stack_ffffffffffffffa0,
             (QTreeWidgetItem *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  in_RDI->d = v;
  in_RDI->par = (QTreeWidgetItem *)0x0;
  QList<QTreeWidgetItem_*>::QList((QList<QTreeWidgetItem_*> *)0x913209);
  Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                (enum_type)in_stack_ffffffffffffffa0);
  QFlags<Qt::ItemFlag>::operator|
            ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  index.i = (Int)QFlags<Qt::ItemFlag>::operator|
                           ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff9c);
  QVar2 = QFlags<Qt::ItemFlag>::operator|
                    ((QFlags<Qt::ItemFlag> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  (in_RDI->itemFlags).super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i
       = (Int)QVar2.super_QFlagsStorageHelper<Qt::ItemFlag,_4>.super_QFlagsStorage<Qt::ItemFlag>.i;
  pQVar3 = treeModel(in_RDI,(QTreeWidget *)v);
  if (pQVar3 != (QTreeModel *)0x0) {
    QListSpecialMethodsBase<QTreeWidgetItem*>::indexOf<QTreeWidgetItem*>
              ((QListSpecialMethodsBase<QTreeWidgetItem_*> *)in_stack_ffffffffffffffa0,
               (QTreeWidgetItem **)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               0x91328b);
    insertChild(in_RDX,index.i,(QTreeWidgetItem *)model);
    columnCount((QTreeWidgetItem *)0x9132c6);
    QList<QList<QWidgetItemData>_>::reserve
              ((QList<QList<QWidgetItemData>_> *)CONCAT44(in_ECX,in_stack_ffffffffffffffc8),
               in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTreeWidgetItem::QTreeWidgetItem(QTreeWidget *treeview, QTreeWidgetItem *after, int type)
    : rtti(type), d(new QTreeWidgetItemPrivate(this))
{
    // do not set this->view here otherwise insertChild() will fail
    if (QTreeModel *model = treeModel(treeview)) {
        int i = model->rootItem->children.indexOf(after) + 1;
        model->rootItem->insertChild(i, this);
        values.reserve(model->headerItem->columnCount());
    }
}